

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_rust_punycode.cc
# Opt level: O3

Nullable<char_*>
absl::lts_20240722::debugging_internal::DecodeRustPunycode(DecodeRustPunycodeOptions options)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  ulong uVar4;
  size_t sVar5;
  uint32_t uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  uint32_t index;
  ulong uVar10;
  Nullable<char_*> pcVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  undefined1 *__src;
  int iVar18;
  ulong __n;
  char *in_stack_00000008;
  char *in_stack_00000010;
  undefined1 *in_stack_00000018;
  undefined1 *in_stack_00000020;
  Utf8ForCodePoint utf8_for_code_point;
  BoundedUtf8LengthSequence<256U> utf8_lengths;
  Utf8ForCodePoint local_90 [4];
  uint32_t local_8c;
  size_t local_88;
  ulong local_80;
  BoundedUtf8LengthSequence<256U> local_78;
  
  __n = 0;
  if (in_stack_00000020 == in_stack_00000018) {
LAB_001011c9:
    pcVar11 = (Nullable<char_*>)0x0;
  }
  else {
    *in_stack_00000018 = 0;
    if (0 < (long)in_stack_00000010 - (long)in_stack_00000008) {
      __n = 0xffffffff;
      uVar8 = 0;
      do {
        bVar1 = in_stack_00000008[uVar8];
        if (bVar1 == 0x5f) {
          __n = uVar8 & 0xffffffff;
        }
        else if ((9 < (byte)(bVar1 - 0x30)) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf)))
        goto LAB_001011c9;
        uVar8 = uVar8 + 1;
      } while ((long)in_stack_00000010 - (long)in_stack_00000008 != uVar8);
      iVar18 = (int)__n;
      if (iVar18 < 0) {
        __n = 0;
      }
      else {
        if ((iVar18 == 0) ||
           ((long)in_stack_00000020 - (long)in_stack_00000018 < (long)(ulong)(iVar18 + 1)))
        goto LAB_001011c9;
        memcpy(in_stack_00000018,in_stack_00000008,__n);
        in_stack_00000018[__n] = 0;
        in_stack_00000008 = in_stack_00000008 + (iVar18 + 1);
      }
    }
    local_78.rep_[6] = 0;
    local_78.rep_[7] = 0;
    local_78.rep_[4] = 0;
    local_78.rep_[5] = 0;
    local_78.rep_[2] = 0;
    local_78.rep_[3] = 0;
    local_78.rep_[0] = 0;
    local_78.rep_[1] = 0;
    uVar8 = __n;
    if (in_stack_00000008 != in_stack_00000010) {
      uVar17 = 0x100;
      if (0x100 < (uint)__n) {
        uVar17 = __n;
      }
      uVar10 = 0x80;
      iVar18 = 0x48;
      uVar9 = 0;
      do {
        if ((int)__n == (int)uVar17) goto LAB_001011c9;
        uVar12 = 0x24;
        lVar13 = 1;
        iVar7 = (int)uVar9;
        while( true ) {
          cVar2 = *in_stack_00000008;
          iVar14 = (int)cVar2;
          if ((byte)(cVar2 - 0x30U) < 10) {
            uVar15 = iVar14 - 0x16;
          }
          else if ((byte)(cVar2 + 0x9fU) < 0x1a) {
            uVar15 = iVar14 - 0x61;
          }
          else {
            if (0x19 < (byte)(cVar2 + 0xbfU)) goto LAB_001011c9;
            uVar15 = iVar14 - 0x41;
          }
          if (((int)uVar15 < 0) ||
             (uVar9 = (ulong)uVar15 * lVar13 + (uVar9 & 0xffffffff), 0x40000000 < uVar9))
          goto LAB_001011c9;
          uVar16 = uVar12 - iVar18;
          if (iVar18 + 0x1aU <= uVar12) {
            uVar16 = 0x1a;
          }
          if (uVar12 <= iVar18 + 1U) {
            uVar16 = 1;
          }
          if (uVar15 < uVar16) break;
          in_stack_00000008 = in_stack_00000008 + 1;
          lVar13 = lVar13 * (ulong)(0x24 - uVar16);
          uVar12 = uVar12 + 0x24;
          if (in_stack_00000008 == in_stack_00000010) goto LAB_001011c9;
        }
        uVar12 = 2;
        if (iVar7 == 0) {
          uVar12 = 700;
        }
        iVar18 = 0;
        uVar4 = (ulong)(uint)((int)uVar9 - iVar7) / (ulong)uVar12;
        uVar15 = (int)__n + 1;
        uVar12 = (int)(uVar4 / uVar15) + (int)uVar4;
        if (0x1c7 < uVar12) {
          iVar18 = 0;
          uVar16 = uVar12;
          do {
            uVar12 = uVar16 / 0x23;
            iVar18 = iVar18 + 0x24;
            bVar3 = 0x3e57 < uVar16;
            uVar16 = uVar12;
          } while (bVar3);
        }
        index = (uint32_t)((uVar9 & 0xffffffff) % (ulong)uVar15);
        uVar10 = (ulong)(uint)((int)uVar10 + (int)((uVar9 & 0xffffffff) / (ulong)uVar15));
        absl::lts_20240722::debugging_internal::Utf8ForCodePoint::Utf8ForCodePoint(local_90,uVar10);
        if ((local_8c == 0) ||
           (iVar7 = (int)uVar8,
           (ulong)((long)in_stack_00000020 - (long)in_stack_00000018) <
           (ulong)(iVar7 + local_8c + 1))) goto LAB_001011c9;
        in_stack_00000008 = in_stack_00000008 + 1;
        iVar18 = iVar18 + (uVar12 * 0x24 & 0xffff) / (uVar12 + 0x26 & 0xffff);
        local_80 = (ulong)(iVar7 + 1);
        uVar6 = BoundedUtf8LengthSequence<256U>::InsertAndReturnSumOfPredecessors
                          (&local_78,index,local_8c);
        __src = in_stack_00000018 + uVar6;
        local_88 = (size_t)local_8c;
        memmove(__src + local_88,__src,(ulong)((int)local_80 - uVar6));
        sVar5 = local_88;
        memcpy(__src,local_90,local_88);
        uVar8 = (ulong)(uint)(iVar7 + (int)sVar5);
        uVar9 = (ulong)(index + 1);
        __n = (ulong)uVar15;
      } while (in_stack_00000008 != in_stack_00000010);
    }
    pcVar11 = in_stack_00000018 + uVar8;
  }
  return pcVar11;
}

Assistant:

absl::Nullable<char*> DecodeRustPunycode(DecodeRustPunycodeOptions options) {
  const char* punycode_begin = options.punycode_begin;
  const char* const punycode_end = options.punycode_end;
  char* const out_begin = options.out_begin;
  char* const out_end = options.out_end;

  // Write a NUL terminator first.  Later memcpy calls will keep bumping it
  // along to its new right place.
  const size_t out_size = static_cast<size_t>(out_end - out_begin);
  if (out_size == 0) return nullptr;
  *out_begin = '\0';

  // RFC 3492 section 6.2 begins here.  We retain the names of integer variables
  // appearing in that text.
  uint32_t n = 128, i = 0, bias = 72, num_chars = 0;

  // If there are any ASCII characters, consume them and their trailing
  // underscore delimiter.
  if (!ConsumeOptionalAsciiPrefix(punycode_begin, punycode_end,
                                  out_begin, out_end, num_chars)) {
    return nullptr;
  }
  uint32_t total_utf8_bytes = num_chars;

  BoundedUtf8LengthSequence<kMaxChars> utf8_lengths;

  // "while the input is not exhausted do begin ... end"
  while (punycode_begin != punycode_end) {
    if (num_chars >= kMaxChars) return nullptr;

    const uint32_t old_i = i;

    if (!ScanNextDelta(punycode_begin, punycode_end, bias, i)) return nullptr;

    // Update bias as in RFC 3492 section 6.1.  (We have inlined adapt.)
    uint32_t delta = i - old_i;
    delta /= (old_i == 0 ? kDamp : 2);
    delta += delta/(num_chars + 1);
    bias = 0;
    while (delta > ((kBase - kTMin) * kTMax)/2) {
      delta /= kBase - kTMin;
      bias += kBase;
    }
    bias += ((kBase - kTMin + 1) * delta)/(delta + kSkew);

    // Back in section 6.2, compute the new code point and insertion index.
    static_assert(
        kMaxI + kMaxCodePoint < (uint64_t{1} << 32),
        "Make kMaxI smaller or n 64 bits wide to prevent silent wraparound");
    n += i/(num_chars + 1);
    i %= num_chars + 1;

    // To actually insert, we need to convert the code point n to UTF-8 and the
    // character index i to an index into the byte stream emitted so far.  First
    // prepare the UTF-8 encoding for n, rejecting surrogates, overlarge values,
    // and anything that won't fit into the remaining output storage.
    Utf8ForCodePoint utf8_for_code_point(n);
    if (!utf8_for_code_point.ok()) return nullptr;
    if (total_utf8_bytes + utf8_for_code_point.length + 1 > out_size) {
      return nullptr;
    }

    // Now insert the new character into both our length map and the output.
    uint32_t n_index =
        utf8_lengths.InsertAndReturnSumOfPredecessors(
            i, utf8_for_code_point.length);
    std::memmove(
        out_begin + n_index + utf8_for_code_point.length, out_begin + n_index,
        total_utf8_bytes + 1 - n_index);
    std::memcpy(out_begin + n_index, utf8_for_code_point.bytes,
                utf8_for_code_point.length);
    total_utf8_bytes += utf8_for_code_point.length;
    ++num_chars;

    // Finally, advance to the next state before continuing.
    ++i;
  }

  return out_begin + total_utf8_bytes;
}